

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  EnumDescriptor *this_00;
  size_t __n;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  LogMessage *other;
  EnumValueDescriptor *pEVar6;
  long *plVar7;
  _func_int **pp_Var8;
  byte bVar9;
  size_type *psVar10;
  long i;
  int64 value;
  int64 int_value;
  string local_f0;
  undefined1 local_d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EnumDescriptor *local_38;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
    bVar4 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffff);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x18])
              (reflection,message,field,local_d0._0_8_ & 0xffffffff);
    return true;
  case 2:
    bVar4 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffffffffffff);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x19])
              (reflection,message,field,local_d0._0_8_);
    break;
  case 3:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffff);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1a])
              (reflection,message,field,local_d0._0_8_ & 0xffffffff);
    break;
  case 4:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffffffffffff);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1b])
              (reflection,message,field,local_d0._0_8_);
    break;
  case 5:
    bVar4 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1d])
              ((int)local_d0._0_8_,reflection,message,field);
    break;
  case 6:
    bVar4 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar4) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1c])
              ((float)(double)local_d0._0_8_,reflection,message,field);
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar4 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,1);
      if (bVar4) {
        (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1e])
                  (reflection,message,field,(ulong)((pointer)local_d0._0_8_ != (pointer)0x0));
        return true;
      }
      return false;
    }
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d0._0_8_ = local_d0 + 0x10;
    bVar4 = ConsumeIdentifier(this,(string *)local_d0);
    if (bVar4) {
      iVar5 = std::__cxx11::string::compare(local_d0);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare(local_d0), iVar5 == 0)) {
        if (*(int *)(field + 0x30) == 3) {
          pp_Var8 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var8 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar9 = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare(local_d0);
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare(local_d0), iVar5 != 0)) {
          std::operator+(&local_58,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_98.field_2._M_allocated_capacity = *psVar10;
            local_98.field_2._8_8_ = plVar7[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar10;
            local_98._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_98._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::operator+(&local_78,&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0.field_2._8_8_ = plVar7[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar10;
            local_f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p)
                            ,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002222f8;
        }
        if (*(int *)(field + 0x30) == 3) {
          pp_Var8 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var8 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar9 = 0;
      }
      bVar4 = true;
      (**pp_Var8)(reflection,message,field,(ulong)bVar9);
    }
    else {
LAB_002222f8:
      bVar4 = false;
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    goto joined_r0x00221d54;
  case 8:
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    this_00 = *(EnumDescriptor **)(field + 0x50);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_d0);
      bVar4 = true;
      if (!bVar3) goto LAB_0022218c;
      pEVar6 = EnumDescriptor::FindValueByName(this_00,(string *)local_d0);
LAB_00221f62:
      if (pEVar6 != (EnumValueDescriptor *)0x0) {
        (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x20])
                  (reflection,message,field,pEVar6);
        bVar4 = false;
        goto LAB_0022218c;
      }
      std::operator+(&local_58,"Unknown enumeration value of \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_78,&local_98,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar7[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_f0
                 );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_00222181;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-","");
      _Var2._M_p = local_f0._M_dataplus._M_p;
      __n = (this->tokenizer_).current_.text._M_string_length;
      local_38 = this_00;
      if ((__n == local_f0._M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                        __n), iVar5 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_f0.field_2) {
          operator_delete(_Var2._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
LAB_00221ef2:
        bVar4 = ConsumeSignedInteger(this,(int64 *)&local_78,0x7fffffff);
        if (bVar4) {
          SimpleItoa_abi_cxx11_
                    (&local_f0,
                     (protobuf *)
                     CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),i);
          std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          pEVar6 = EnumDescriptor::FindValueByNumber(local_38,(int)local_78._M_dataplus._M_p);
          goto LAB_00221f62;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_f0.field_2) {
          operator_delete(_Var2._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_00221ef2;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Expected integer or identifier.","");
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f0);
        local_58.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        local_58._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_00222189;
LAB_00222181:
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
LAB_00222189:
    bVar4 = true;
LAB_0022218c:
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    if (bVar4) {
      return false;
    }
    return true;
  case 9:
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d0._0_8_ = local_d0 + 0x10;
    bVar4 = ConsumeString(this,(string *)local_d0);
    if (bVar4) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1f])
                (reflection,message,field,local_d0);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
joined_r0x00221d54:
    if (!bVar4) {
      return false;
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x285);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_d0,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  return true;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, static_cast<float>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier.");
          return false;
        }

        if (enum_value == NULL) {
          ReportError("Unknown enumeration value of \"" + value  + "\" for "
                      "field \"" + field->name() + "\".");
          return false;
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }